

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellBST::ComputeNF
          (ChElementShellBST *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double *pdVar4;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  ActualDstType actualDst;
  
  *detJ = this->area + this->area;
  lVar1 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar1 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar1 != 0) {
    memset((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar1 * 8);
  }
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
LAB_007a041a:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < lVar1) {
      pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar5 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
        uVar5 = uVar6;
      }
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      if (uVar5 != 0) {
        uVar6 = 0;
        do {
          pdVar4[uVar6] = U * pdVar2[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (uVar5 < 3) {
        do {
          pdVar4[uVar5] = U * pdVar2[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar5 != 3);
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_007a041a;
      if (5 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
      {
        pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 3;
        uVar5 = 3;
        if ((((ulong)pdVar4 & 7) == 0) &&
           (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
          uVar5 = uVar6;
        }
        pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        if (uVar5 != 0) {
          uVar6 = 0;
          do {
            pdVar4[uVar6] = V * pdVar2[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        if (uVar5 < 3) {
          do {
            pdVar4[uVar5] = V * pdVar2[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar5 != 3);
        }
        if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3
           ) goto LAB_007a041a;
        if (8 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows) {
          pdVar4 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data + 6;
          uVar5 = 3;
          if ((((ulong)pdVar4 & 7) == 0) &&
             (uVar6 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), uVar6 < 3)) {
            uVar5 = uVar6;
          }
          dVar3 = (1.0 - U) - V;
          pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          if (uVar5 != 0) {
            uVar6 = 0;
            do {
              pdVar4[uVar6] = dVar3 * pdVar2[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
          }
          if (uVar5 < 3) {
            do {
              pdVar4[uVar5] = dVar3 * pdVar2[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar5 != 3);
          }
          return;
        }
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementShellBST::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    // det of jacobian at u,v
    detJ = this->area*2.0;  

	Qi.setZero();

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);

    Qi.segment(3, 3) = N(1) * F.segment(0, 3);

    Qi.segment(6, 3) = N(2) * F.segment(0, 3);
}